

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O2

Edits * __thiscall
icu_63::Edits::mergeAndAppend(Edits *this,Edits *ab,Edits *bc,UErrorCode *errorCode)

{
  int iVar1;
  int32_t iVar2;
  UBool UVar3;
  UErrorCode UVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int newLength;
  int local_ac;
  char local_a5;
  int local_a4;
  Iterator bcIter;
  Iterator abIter;
  
  if (U_ZERO_ERROR < *errorCode) {
    return this;
  }
  UVar4 = this->errorCode_;
  if (this->errorCode_ < U_ILLEGAL_ARGUMENT_ERROR) {
    abIter.array = ab->array;
    abIter.length = ab->length;
    abIter.index = 0;
    abIter.remaining = 0;
    abIter.onlyChanges_ = '\0';
    abIter.coarse = '\0';
    abIter.dir = '\0';
    abIter.changed = '\0';
    abIter.oldLength_ = 0;
    abIter.newLength_ = 0;
    abIter.srcIndex = 0;
    abIter.replIndex = 0;
    abIter.destIndex = 0;
    bcIter.array = bc->array;
    bcIter.length = bc->length;
    bcIter.index = 0;
    bcIter.remaining = 0;
    bcIter.onlyChanges_ = '\0';
    bcIter.coarse = '\0';
    bcIter.dir = '\0';
    bcIter.changed = '\0';
    bcIter.oldLength_ = 0;
    bcIter.newLength_ = 0;
    bcIter.srcIndex = 0;
    bcIter.replIndex = 0;
    bcIter.destIndex = 0;
    local_a4 = 0;
    local_a5 = '\x01';
    UVar3 = '\x01';
    iVar7 = 0;
    iVar6 = 0;
    local_ac = 0;
    newLength = 0;
    iVar5 = 0;
LAB_002ec31c:
    if ((iVar6 == 0) && (UVar3 != '\0')) {
      UVar3 = Iterator::next(&bcIter,errorCode);
      iVar2 = bcIter.newLength_;
      if (UVar3 == '\0') {
        UVar3 = '\0';
        iVar6 = 0;
        goto LAB_002ec37b;
      }
      iVar6 = bcIter.oldLength_;
      iVar5 = bcIter.newLength_;
      if (bcIter.oldLength_ != 0) goto LAB_002ec37b;
      newLength = newLength + bcIter.newLength_;
      if (iVar7 != 0) goto code_r0x002ec34d;
      goto LAB_002ec356;
    }
LAB_002ec37b:
    iVar1 = iVar7;
    if (iVar7 != 0) {
LAB_002ec3c1:
      if (iVar6 == 0) goto LAB_002ec533;
      if (abIter.changed == '\0') {
        if (bcIter.changed == '\0') {
          if (local_ac != 0 || newLength != 0) {
            addReplace(this,local_ac,newLength);
          }
          iVar6 = iVar5;
          if (local_a4 < iVar5) {
            iVar6 = local_a4;
          }
          addUnchanged(this,iVar6);
          iVar7 = local_a4 - iVar6;
          iVar6 = iVar5 - iVar6;
          iVar5 = iVar6;
          local_a4 = iVar7;
          goto LAB_002ec513;
        }
        iVar7 = iVar1 - iVar6;
        if (iVar6 <= iVar1) {
          addReplace(this,iVar6 + local_ac,newLength + iVar5);
          local_a4 = iVar7;
          goto LAB_002ec429;
        }
      }
      else if (bcIter.changed == '\0') {
        if (iVar1 <= iVar6) {
          addReplace(this,local_ac + local_a4,newLength + iVar1);
          iVar6 = iVar6 - iVar1;
          iVar7 = 0;
          iVar5 = iVar6;
          goto LAB_002ec513;
        }
      }
      else if (iVar1 == iVar6) {
        addReplace(this,local_ac + local_a4,newLength + iVar5);
        iVar7 = 0;
LAB_002ec429:
        iVar6 = 0;
LAB_002ec513:
        local_ac = 0;
        newLength = 0;
        goto LAB_002ec31c;
      }
      local_ac = local_ac + local_a4;
      newLength = newLength + iVar5;
      iVar7 = iVar1 - iVar6;
      if (iVar1 < iVar6) {
        iVar6 = iVar6 - iVar1;
        iVar7 = 0;
        iVar5 = 0;
      }
      else {
        local_a4 = 0;
        iVar6 = 0;
      }
      goto LAB_002ec31c;
    }
    if ((local_a5 == '\0') || (local_a5 = Iterator::next(&abIter,errorCode), local_a5 == '\0'))
    goto LAB_002ec52f;
    local_a4 = abIter.oldLength_;
    iVar1 = abIter.newLength_;
    if (abIter.newLength_ != 0) goto LAB_002ec3c1;
    local_ac = local_ac + abIter.oldLength_;
    if (iVar6 != bcIter.oldLength_) {
      iVar7 = 0;
      if (bcIter.changed != '\0') goto LAB_002ec31c;
    }
    addReplace(this,local_ac,newLength);
    iVar7 = 0;
    goto LAB_002ec369;
  }
LAB_002ec29b:
  *errorCode = UVar4;
  return this;
code_r0x002ec34d:
  iVar6 = 0;
  if (abIter.changed == '\0') {
LAB_002ec356:
    addReplace(this,local_ac,newLength);
    iVar6 = 0;
    iVar5 = iVar2;
LAB_002ec369:
    local_ac = 0;
    newLength = 0;
  }
  goto LAB_002ec31c;
LAB_002ec52f:
  if (iVar6 == 0) {
    if (local_ac != 0 || newLength != 0) {
      addReplace(this,local_ac,newLength);
    }
    UVar4 = this->errorCode_;
    if (this->errorCode_ < U_ILLEGAL_ARGUMENT_ERROR || U_ZERO_ERROR < *errorCode) {
      return this;
    }
  }
  else {
LAB_002ec533:
    if (U_ZERO_ERROR < *errorCode) {
      return this;
    }
    UVar4 = U_ILLEGAL_ARGUMENT_ERROR;
    if (U_ILLEGAL_ARGUMENT_ERROR < this->errorCode_) {
      UVar4 = this->errorCode_;
    }
  }
  goto LAB_002ec29b;
}

Assistant:

Edits &Edits::mergeAndAppend(const Edits &ab, const Edits &bc, UErrorCode &errorCode) {
    if (copyErrorTo(errorCode)) { return *this; }
    // Picture string a --(Edits ab)--> string b --(Edits bc)--> string c.
    // Parallel iteration over both Edits.
    Iterator abIter = ab.getFineIterator();
    Iterator bcIter = bc.getFineIterator();
    UBool abHasNext = TRUE, bcHasNext = TRUE;
    // Copy iterator state into local variables, so that we can modify and subdivide spans.
    // ab old & new length, bc old & new length
    int32_t aLength = 0, ab_bLength = 0, bc_bLength = 0, cLength = 0;
    // When we have different-intermediate-length changes, we accumulate a larger change.
    int32_t pending_aLength = 0, pending_cLength = 0;
    for (;;) {
        // At this point, for each of the two iterators:
        // Either we are done with the locally cached current edit,
        // and its intermediate-string length has been reset,
        // or we will continue to work with a truncated remainder of this edit.
        //
        // If the current edit is done, and the iterator has not yet reached the end,
        // then we fetch the next edit. This is true for at least one of the iterators.
        //
        // Normally it does not matter whether we fetch from ab and then bc or vice versa.
        // However, the result is observably different when
        // ab deletions meet bc insertions at the same intermediate-string index.
        // Some users expect the bc insertions to come first, so we fetch from bc first.
        if (bc_bLength == 0) {
            if (bcHasNext && (bcHasNext = bcIter.next(errorCode)) != 0) {
                bc_bLength = bcIter.oldLength();
                cLength = bcIter.newLength();
                if (bc_bLength == 0) {
                    // insertion
                    if (ab_bLength == 0 || !abIter.hasChange()) {
                        addReplace(pending_aLength, pending_cLength + cLength);
                        pending_aLength = pending_cLength = 0;
                    } else {
                        pending_cLength += cLength;
                    }
                    continue;
                }
            }
            // else see if the other iterator is done, too.
        }
        if (ab_bLength == 0) {
            if (abHasNext && (abHasNext = abIter.next(errorCode)) != 0) {
                aLength = abIter.oldLength();
                ab_bLength = abIter.newLength();
                if (ab_bLength == 0) {
                    // deletion
                    if (bc_bLength == bcIter.oldLength() || !bcIter.hasChange()) {
                        addReplace(pending_aLength + aLength, pending_cLength);
                        pending_aLength = pending_cLength = 0;
                    } else {
                        pending_aLength += aLength;
                    }
                    continue;
                }
            } else if (bc_bLength == 0) {
                // Both iterators are done at the same time:
                // The intermediate-string lengths match.
                break;
            } else {
                // The ab output string is shorter than the bc input string.
                if (!copyErrorTo(errorCode)) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                }
                return *this;
            }
        }
        if (bc_bLength == 0) {
            // The bc input string is shorter than the ab output string.
            if (!copyErrorTo(errorCode)) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            }
            return *this;
        }
        //  Done fetching: ab_bLength > 0 && bc_bLength > 0

        // The current state has two parts:
        // - Past: We accumulate a longer ac edit in the "pending" variables.
        // - Current: We have copies of the current ab/bc edits in local variables.
        //   At least one side is newly fetched.
        //   One side might be a truncated remainder of an edit we fetched earlier.

        if (!abIter.hasChange() && !bcIter.hasChange()) {
            // An unchanged span all the way from string a to string c.
            if (pending_aLength != 0 || pending_cLength != 0) {
                addReplace(pending_aLength, pending_cLength);
                pending_aLength = pending_cLength = 0;
            }
            int32_t unchangedLength = aLength <= cLength ? aLength : cLength;
            addUnchanged(unchangedLength);
            ab_bLength = aLength -= unchangedLength;
            bc_bLength = cLength -= unchangedLength;
            // At least one of the unchanged spans is now empty.
            continue;
        }
        if (!abIter.hasChange() && bcIter.hasChange()) {
            // Unchanged a->b but changed b->c.
            if (ab_bLength >= bc_bLength) {
                // Split the longer unchanged span into change + remainder.
                addReplace(pending_aLength + bc_bLength, pending_cLength + cLength);
                pending_aLength = pending_cLength = 0;
                aLength = ab_bLength -= bc_bLength;
                bc_bLength = 0;
                continue;
            }
            // Handle the shorter unchanged span below like a change.
        } else if (abIter.hasChange() && !bcIter.hasChange()) {
            // Changed a->b and then unchanged b->c.
            if (ab_bLength <= bc_bLength) {
                // Split the longer unchanged span into change + remainder.
                addReplace(pending_aLength + aLength, pending_cLength + ab_bLength);
                pending_aLength = pending_cLength = 0;
                cLength = bc_bLength -= ab_bLength;
                ab_bLength = 0;
                continue;
            }
            // Handle the shorter unchanged span below like a change.
        } else {  // both abIter.hasChange() && bcIter.hasChange()
            if (ab_bLength == bc_bLength) {
                // Changes on both sides up to the same position. Emit & reset.
                addReplace(pending_aLength + aLength, pending_cLength + cLength);
                pending_aLength = pending_cLength = 0;
                ab_bLength = bc_bLength = 0;
                continue;
            }
        }
        // Accumulate the a->c change, reset the shorter side,
        // keep a remainder of the longer one.
        pending_aLength += aLength;
        pending_cLength += cLength;
        if (ab_bLength < bc_bLength) {
            bc_bLength -= ab_bLength;
            cLength = ab_bLength = 0;
        } else {  // ab_bLength > bc_bLength
            ab_bLength -= bc_bLength;
            aLength = bc_bLength = 0;
        }
    }
    if (pending_aLength != 0 || pending_cLength != 0) {
        addReplace(pending_aLength, pending_cLength);
    }
    copyErrorTo(errorCode);
    return *this;
}